

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_el_hahn.cpp
# Opt level: O0

void __thiscall
PP_el_hahn::monochromaticDiffusion
          (PP_el_hahn *this,double mx0,double my0,double mz0,double dw,bool rotFrame)

{
  double *pdVar1;
  ostream *poVar2;
  double dVar3;
  double local_230;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_a1;
  string local_a0;
  double local_80;
  double t00;
  double t0;
  double tempMuz0;
  double tmpZ;
  double tmpY;
  double tmpX;
  double tmpBxy;
  double tmpBz0;
  double dt;
  double dStack_30;
  bool rotFrame_local;
  double dw_local;
  double mz0_local;
  double my0_local;
  double mx0_local;
  PP_el_hahn *this_local;
  
  tmpBxy = (this->super_PP_sigRMN).Bz0;
  tmpX = (this->super_PP_sigRMN).Bxy;
  t0 = (this->super_PP_sigRMN).muz0;
  (this->super_PP_sigRMN).muz0 = t0 * (dw / ((this->super_PP_sigRMN).gamma * tmpBxy) + 1.0);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + dw / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  dVar3 = (this->super_PP_sigRMN).T1;
  pdVar1 = &(this->super_PP_sigRMN).T2;
  if (dVar3 < *pdVar1 || dVar3 == *pdVar1) {
    local_230 = (this->super_PP_sigRMN).T2;
  }
  else {
    local_230 = (this->super_PP_sigRMN).T1;
  }
  t00 = local_230;
  (this->super_PP_sigRMN).sigLength = 200;
  tmpBz0 = local_230 / (double)(this->super_PP_sigRMN).sigLength;
  local_80 = 0.0;
  tempMuz0 = mz0;
  tmpZ = my0;
  tmpY = mx0;
  dt._7_1_ = rotFrame;
  dStack_30 = dw;
  dw_local = mz0;
  mz0_local = my0;
  my0_local = mx0;
  mx0_local = (double)this;
  dVar3 = PP_sigRMN::generateFIDsignalWithDiffusion(&this->super_PP_sigRMN,mx0,my0,mz0,tmpBz0,dw);
  local_80 = dVar3 + local_80;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
  tmpY = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
  tmpZ = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
  tempMuz0 = *pdVar1;
  if ((dt._7_1_ & 1) == 0) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"initSig.txt",&local_a1);
  C_matrix<double>::save(&(this->super_PP_sigRMN).MU,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"initSigTime.txt",&local_d9);
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_80);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + dStack_30 / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = tmpX;
  (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
  (this->super_PP_sigRMN).sigLength = 4000;
  tmpBz0 = (this->super_PP_sigRMN).tw / (double)(this->super_PP_sigRMN).sigLength;
  dVar3 = PP_sigRMN::generateRMNsignal(&this->super_PP_sigRMN,tmpY,tmpZ,tempMuz0,tmpBz0,dStack_30);
  local_80 = dVar3 + local_80;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
  tmpY = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
  tmpZ = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
  tempMuz0 = *pdVar1;
  if ((dt._7_1_ & 1) == 0) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"p90.txt",&local_101);
  C_matrix<double>::save(&(this->super_PP_sigRMN).MU,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"p90Time.txt",&local_129);
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_80);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + dStack_30 / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  tmpBz0 = ((this->super_PP_sigRMN).TE * 0.5 + -(this->super_PP_sigRMN).tw) /
           (double)(this->super_PP_sigRMN).sigLength;
  dVar3 = PP_sigRMN::generateFIDsignalWithDiffusion
                    (&this->super_PP_sigRMN,tmpY,tmpZ,tempMuz0,tmpBz0,dStack_30);
  local_80 = dVar3 + local_80;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
  tmpY = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
  tmpZ = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
  tempMuz0 = *pdVar1;
  if ((dt._7_1_ & 1) == 0) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"fid.txt",&local_151);
  C_matrix<double>::save(&(this->super_PP_sigRMN).MU,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"fidTime.txt",&local_179);
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + dStack_30 / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = tmpX;
  (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
  (this->super_PP_sigRMN).sigLength = 4000;
  tmpBz0 = ((this->super_PP_sigRMN).tw * 2.0) / (double)(this->super_PP_sigRMN).sigLength;
  dVar3 = PP_sigRMN::generateRMNsignal(&this->super_PP_sigRMN,tmpY,tmpZ,tempMuz0,tmpBz0,dStack_30);
  local_80 = dVar3 + local_80;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
  tmpY = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
  tmpZ = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
  tempMuz0 = *pdVar1;
  if ((dt._7_1_ & 1) == 0) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"p180.txt",&local_1a1);
  C_matrix<double>::save(&(this->super_PP_sigRMN).MU,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"p180Time.txt",&local_1c9)
  ;
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_80);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + dStack_30 / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 2000;
  tmpBz0 = ((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) /
           (double)(this->super_PP_sigRMN).sigLength;
  dVar3 = PP_sigRMN::generateFIDsignalWithDiffusion
                    (&this->super_PP_sigRMN,tmpY,tmpZ,tempMuz0,tmpBz0,dStack_30);
  local_80 = dVar3 + local_80;
  if ((dt._7_1_ & 1) == 0) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"spinEcho.txt",&local_1f1)
  ;
  C_matrix<double>::save(&(this->super_PP_sigRMN).MU,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"spinEchoTime.txt",&local_219);
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  (this->super_PP_sigRMN).Bz0 = tmpBxy;
  (this->super_PP_sigRMN).Bxy = tmpX;
  (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
  (this->super_PP_sigRMN).muz0 = t0;
  return;
}

Assistant:

void PP_el_hahn::monochromaticDiffusion(double mx0, double my0, double mz0, double dw, bool rotFrame)
{
    //the perturbating magnetic field pulsation is gamma*Bz0, but the actual constant field is Bz0+(dw/gamma)
    double dt;
    double tmpBz0 = Bz0;
    double tmpBxy = Bxy;
    double tmpX=mx0, tmpY=my0, tmpZ=mz0;
    double tempMuz0=muz0;
    muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));

    /******************************************************/
    /** initialization */
    //apply the constant magnetic field during t0
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    double t0=MAX(T1,T2);
    sigLength=200;
    dt=t0/((double) sigLength);
    double t00=0.0;

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("initSig.txt");
    T.save("initSigTime.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** first pulse */
    //play one pi/2-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    //t90 = Pi/(2.0*gamma*Bxy);
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("p90.txt");
    T.save("p90Time.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** free induction decay */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=(0.5*TE - tw)/((double) sigLength);
    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("fid.txt");
    T.save("fidTime.txt");



    /******************************************************/
    /** second pulse */
    //play the pi-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=2.0*tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("p180.txt");
    T.save("p180Time.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** spin echo */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=2000;
    dt=(TE-tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    if(!rotFrame) frameToFix(t00);
    MU.save("spinEcho.txt");
    T.save("spinEchoTime.txt");

    //restore the parameters
    Bz0=tmpBz0;
    Bxy=tmpBxy; omega=gamma*Bz0;
    muz0=tempMuz0;
    return;
    return;
}